

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# f77_wrap3.c
# Opt level: O2

void ftghbn_(int *A1,int *A2,int *A3,int *A4,char *A5,char *A6,char *A7,char *A8,int *A9,int *A10,
            size_t C5,size_t C6,size_t C7,size_t C8)

{
  char **__ptr;
  char **ppcVar1;
  char *pcVar2;
  char **B;
  char *s;
  size_t sVar3;
  size_t sVar4;
  int felem_len;
  int iVar5;
  uint uVar6;
  unsigned_long uVar7;
  int felem_len_00;
  int iVar8;
  long lVar9;
  int nelem;
  ulong uVar10;
  long B3;
  ulong local_78;
  char **local_70;
  char *local_68;
  ulong local_60;
  int *local_58;
  fitsfile *local_50;
  int *local_48;
  long B9;
  long tfields;
  
  local_50 = gFitsFiles[*A1];
  uVar6 = *A2;
  lVar9 = (long)(int)uVar6;
  local_68 = A5;
  local_58 = A3;
  local_48 = A4;
  ffgkyj(local_50,"TFIELDS",&tfields,(char *)0x0,A10);
  if (tfields < lVar9) {
    uVar6 = (uint)tfields;
  }
  local_60 = tfields & 0xffffffff;
  if (-1 < lVar9) {
    local_60 = (ulong)uVar6;
  }
  uVar10 = 1;
  if (1 < (int)local_60) {
    uVar10 = local_60;
  }
  B3 = (long)*A3;
  uVar7 = C5;
  if (C5 < gMinStrLen) {
    uVar7 = gMinStrLen;
  }
  uVar6 = (int)uVar7 + 1;
  sVar3 = uVar10 * 8;
  ppcVar1 = (char **)malloc(sVar3);
  nelem = (int)uVar10;
  local_78 = (ulong)uVar6;
  local_70 = ppcVar1;
  pcVar2 = (char *)malloc((ulong)(uVar6 * nelem));
  *ppcVar1 = pcVar2;
  pcVar2 = f2cstrv2(A5,pcVar2,(int)C5,uVar6,nelem);
  vindex(ppcVar1,uVar6,nelem,pcVar2);
  felem_len = (int)C6;
  iVar5 = felem_len;
  if (C6 < gMinStrLen) {
    iVar5 = (int)gMinStrLen;
  }
  iVar5 = iVar5 + 1;
  ppcVar1 = (char **)malloc(sVar3);
  pcVar2 = (char *)malloc((ulong)(uint)(iVar5 * nelem));
  *ppcVar1 = pcVar2;
  pcVar2 = f2cstrv2(A6,pcVar2,felem_len,iVar5,nelem);
  vindex(ppcVar1,iVar5,nelem,pcVar2);
  felem_len_00 = (int)C7;
  iVar8 = felem_len_00;
  if (C7 < gMinStrLen) {
    iVar8 = (int)gMinStrLen;
  }
  iVar8 = iVar8 + 1;
  B = (char **)malloc(sVar3);
  pcVar2 = (char *)malloc((ulong)(uint)(iVar8 * nelem));
  *B = pcVar2;
  pcVar2 = f2cstrv2(A7,pcVar2,felem_len_00,iVar8,nelem);
  vindex(B,iVar8,nelem,pcVar2);
  sVar4 = gMinStrLen;
  if (gMinStrLen <= C8) {
    sVar4 = C8;
  }
  s = (char *)malloc(sVar4 + 1);
  s[C8] = '\0';
  pcVar2 = A8;
  memcpy(s,A8,C8);
  kill_trailing(s,(char)pcVar2);
  __ptr = local_70;
  B9 = (long)*A9;
  ffghbn(local_50,(int)local_60,&B3,local_48,local_70,ppcVar1,B,s,&B9,A10);
  *local_58 = (int)B3;
  c2fstrv2(*__ptr,local_68,(int)local_78,(int)C5,nelem);
  free(*__ptr);
  free(__ptr);
  c2fstrv2(*ppcVar1,A6,iVar5,felem_len,nelem);
  free(*ppcVar1);
  free(ppcVar1);
  c2fstrv2(*B,A7,iVar8,felem_len_00,nelem);
  free(*B);
  free(B);
  sVar3 = strlen(s);
  sVar4 = C8;
  if (sVar3 < C8) {
    sVar4 = sVar3;
  }
  memcpy(A8,s,sVar4);
  if (sVar3 <= C8 && C8 - sVar3 != 0) {
    memset(A8 + sVar3,0x20,C8 - sVar3);
  }
  free(s);
  *A9 = (int)B9;
  return;
}

Assistant:

CFextern VOID_cfF(FTGHBN,ftghbn)
CFARGT14(NCF,DCF,ABSOFT_cf2(VOID),FITSUNIT,INT,PLONG,PINT,PSTRINGV,PSTRINGV,PSTRINGV,PSTRING,PLONG,PINT,CF_0,CF_0,CF_0,CF_0))
{
   QCF(FITSUNIT,1)
   QCF(INT,2)
   QCF(PLONG,3)
   QCF(PINT,4)
   QCF(PSTRINGV,5)
   QCF(PSTRINGV,6)
   QCF(PSTRINGV,7)
   QCF(PSTRING,8)
   QCF(PLONG,9)
   QCF(PINT,10)

   fitsfile *fptr;
   long tfields;
   int maxdim,*status;

   fptr = TCF(ftghbn,FITSUNIT,1,0);
   status =  TCF(ftghbn,PINT,10,0);
   maxdim =  TCF(ftghbn,INT,2,0);
   ffgkyj( fptr, "TFIELDS", &tfields, 0, status );
   maxdim = (maxdim<0) ? tfields : _cfMIN(tfields,maxdim);

   ffghbn(   fptr, maxdim
             TCF(ftghbn,PLONG,3,1)
             TCF(ftghbn,PINT,4,1)
             TCF(ftghbn,PSTRINGV,5,1)
             TCF(ftghbn,PSTRINGV,6,1)
             TCF(ftghbn,PSTRINGV,7,1)
             TCF(ftghbn,PSTRING,8,1)
             TCF(ftghbn,PLONG,9,1)
             , status );

   RCF(FITSUNIT,1)
   RCF(INT,2)
   RCF(PLONG,3)
   RCF(PINT,4)
   RCF(PSTRINGV,5)
   RCF(PSTRINGV,6)
   RCF(PSTRINGV,7)
   RCF(PSTRING,8)
   RCF(PLONG,9)
   RCF(PINT,10)
}